

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safequeue.h
# Opt level: O3

bool __thiscall SafeQueue<WriterData>::empty(SafeQueue<WriterData> *this)

{
  _Elt_pointer pWVar1;
  _Elt_pointer pWVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mtx);
  if (iVar3 == 0) {
    pWVar1 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    pWVar2 = (this->m_queue).c.super__Deque_base<WriterData,_std::allocator<WriterData>_>._M_impl.
             super__Deque_impl_data._M_start._M_cur;
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mtx);
    return pWVar1 == pWVar2;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool empty() const
    {
        std::lock_guard lk(m_mtx);

        return m_queue.empty();
    }